

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(void)

{
  initializer_list<int> __l;
  raw serializer;
  Data data;
  Sample_t<kiste::terminal_t,_Data,_kiste::raw> sample;
  
  sample.child = (terminal_t *)0x200000001;
  sample.data = (_data_t *)0x400000003;
  sample._serialize = (_serializer_t *)0x600000005;
  __l._M_len = 6;
  __l._M_array = (iterator)&sample;
  std::vector<int,_std::allocator<int>_>::vector(&data.items,__l,(allocator_type *)&serializer);
  serializer._os = (ostream *)&std::cout;
  sample.child = (terminal_t *)&kiste::terminal;
  sample.data = &data;
  sample._serialize = &serializer;
  test::Sample_t<kiste::terminal_t,_Data,_kiste::raw>::render(&sample);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&data);
  return 0;
}

Assistant:

int main()
{
  const auto data = Data{};
  auto& os = std::cout;
  auto serializer = kiste::raw{os};
  auto sample = test::Sample(data, serializer);

  sample.render();
}